

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_01;
  bool bVar2;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_02;
  TargetDependSet *pTVar3;
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *__x;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  depVisited;
  undefined1 local_a0 [16];
  undefined1 local_90 [64];
  key_type local_50;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_48;
  
  bVar2 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_a0._0_8_ = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CMAKE_COLOR_MAKEFILE","");
    bVar2 = cmMakefile::IsSet(pcVar1,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
    }
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    if (bVar2) {
      local_a0._0_8_ = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CMAKE_COLOR_MAKEFILE","");
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_a0);
    }
    else {
      local_a0._0_8_ = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"CMAKE_COLOR_DIAGNOSTICS","");
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_a0);
    }
    this->ColorMakefile = bVar2;
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
    }
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_a0._0_8_ = (cmGeneratorTarget *)local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES","");
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_a0);
  this->SkipPreprocessedSourceRules = bVar2;
  if ((cmGeneratorTarget *)local_a0._0_8_ != (cmGeneratorTarget *)local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_a0._0_8_ = (cmGeneratorTarget *)local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES","");
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_a0);
  this->SkipAssemblySourceRules = bVar2;
  if ((cmGeneratorTarget *)local_a0._0_8_ != (cmGeneratorTarget *)local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
  }
  local_90._32_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            (&local_48,(cmGlobalGenerator *)local_90._32_8_,(cmLocalGenerator *)this);
  if (local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this_00 = &this->CommandsVisited;
    local_90._40_8_ =
         local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    p_Var5 = (_Base_ptr)
             local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    p_Var6 = (_Base_ptr)
             local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_90._48_8_ = this;
    do {
      this_01 = *(cmGeneratorTarget **)p_Var6;
      bVar2 = cmGeneratorTarget::IsInBuildSystem(this_01);
      if (bVar2) {
        local_a0._0_8_ = this_01;
        this_02 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                   *)std::
                     map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
                     ::operator[](this_00,(key_type *)local_a0);
        local_90._56_8_ = p_Var6;
        pTVar3 = cmGlobalGenerator::GetTargetDirectDepends
                           ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator,this_01);
        for (p_Var4 = (pTVar3->
                      super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 !=
            &(pTVar3->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          local_50 = *(key_type *)(p_Var4 + 1);
          __x = &std::
                 map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
                 ::operator[](this_00,&local_50)->_M_t;
          std::
          _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          ::_Rb_tree((_Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                      *)local_a0,__x);
          std::
          _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmSourceFile_const*>>
                    (this_02,(_Rb_tree_const_iterator<const_cmSourceFile_*>)local_90._8_8_,
                     (_Base_ptr)(local_a0 + 8));
          std::
          _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          ::~_Rb_tree((_Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                       *)local_a0);
        }
        cmMakefileTargetGenerator::New((cmMakefileTargetGenerator *)local_a0,this_01);
        p_Var6 = (_Base_ptr)local_90._56_8_;
        this = (cmLocalUnixMakefileGenerator3 *)local_90._48_8_;
        p_Var5 = (_Base_ptr)local_90._40_8_;
        if ((cmGeneratorTarget *)local_a0._0_8_ != (cmGeneratorTarget *)0x0) {
          (**(code **)(*(long *)local_a0._0_8_ + 0x18))();
          cmGlobalUnixMakefileGenerator3::RecordTargetProgress
                    ((cmGlobalUnixMakefileGenerator3 *)local_90._32_8_,
                     (cmMakefileTargetGenerator *)local_a0._0_8_);
          if ((cmGeneratorTarget *)local_a0._0_8_ != (cmGeneratorTarget *)0x0) {
            (**(code **)(*(long *)local_a0._0_8_ + 8))();
          }
        }
      }
      p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
    } while (p_Var6 != p_Var5);
  }
  if ((_Base_ptr)
      local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    if (this->Makefile->IsSet("CMAKE_COLOR_MAKEFILE")) {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
    } else {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_DIAGNOSTICS");
    }
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    auto& gtVisited = this->GetCommandsVisited(gt);
    const auto& deps = this->GlobalGenerator->GetTargetDirectDepends(gt);
    for (const auto& d : deps) {
      // Take the union of visited source files of custom commands
      auto depVisited = this->GetCommandsVisited(d);
      gtVisited.insert(depVisited.begin(), depVisited.end());
    }

    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(gt));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}